

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

void testing::internal::UniversalTersePrinter<const_char_*>::Print(char *str,ostream *os)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ostream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  allocator<char> local_31;
  string local_30 [16];
  undefined8 in_stack_ffffffffffffffe0;
  char *in_stack_ffffffffffffffe8;
  
  if (in_RDI == (ostream *)0x0) {
    std::operator<<((ostream *)in_RSI,"NULL");
  }
  else {
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_31;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_RSI,in_stack_ffffffffffffffe8,(allocator<char> *)in_stack_ffffffffffffffe0);
    UniversalPrint<std::__cxx11::string>(value,in_RDI);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  return;
}

Assistant:

static void Print(const char* str, ::std::ostream* os) {
    if (str == NULL) {
      *os << "NULL";
    } else {
      UniversalPrint(string(str), os);
    }
  }